

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_mct_data_group
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_image_t *poVar2;
  opj_tcp_t *poVar3;
  OPJ_BYTE *pOVar4;
  OPJ_SIZE_T OVar5;
  char *fmt;
  uint uVar6;
  ulong uVar7;
  opj_simple_mcc_decorrelation_data_t *poVar8;
  OPJ_UINT32 OVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  OPJ_UINT32 *pOVar14;
  bool bVar15;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14af,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream == (opj_stream_private *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14b0,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14b1,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  pOVar4 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
  poVar2 = p_j2k->m_private_image;
  OVar9 = poVar2->numcomps;
  uVar1 = OVar9 + 6;
  uVar7 = (ulong)uVar1;
  if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar1) {
    pOVar4 = (OPJ_BYTE *)opj_realloc(pOVar4,uVar7);
    if (pOVar4 == (OPJ_BYTE *)0x0) {
      opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
      (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
      (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
      fmt = "Not enough memory to write CBD marker\n";
LAB_0011a2f2:
      opj_event_msg(p_manager,1,fmt);
      return 0;
    }
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar4;
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar1;
  }
  opj_write_bytes_LE(pOVar4,0xff78,2);
  opj_write_bytes_LE(pOVar4 + 2,OVar9 + 4,2);
  opj_write_bytes_LE(pOVar4 + 4,poVar2->numcomps,2);
  pOVar14 = &poVar2->comps->sgnd;
  for (lVar11 = 0; (uint)lVar11 < poVar2->numcomps; lVar11 = lVar11 + 1) {
    opj_write_bytes_LE(pOVar4 + lVar11 + 6,pOVar14[-2] - 1 | *pOVar14 << 7,1);
    pOVar14 = pOVar14 + 0x10;
  }
  OVar5 = opj_stream_write_data
                    (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar7,p_manager
                    );
  if (OVar5 == uVar7) {
    poVar3 = (p_j2k->m_cp).tcps;
    uVar1 = p_j2k->m_current_tile_number;
    pOVar14 = &(poVar3[uVar1].m_mct_records)->m_data_size;
    for (uVar6 = 0; uVar6 < poVar3[uVar1].m_nb_mct_records; uVar6 = uVar6 + 1) {
      uVar13 = *pOVar14;
      uVar10 = uVar13 + 10;
      uVar7 = (ulong)uVar10;
      pOVar4 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
      if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar10) {
        pOVar4 = (OPJ_BYTE *)opj_realloc(pOVar4,uVar7);
        if (pOVar4 == (OPJ_BYTE *)0x0) {
          opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
          (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
          (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
          fmt = "Not enough memory to write MCT marker\n";
          goto LAB_0011a2f2;
        }
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar4;
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar10;
      }
      opj_write_bytes_LE(pOVar4,0xff74,2);
      opj_write_bytes_LE(pOVar4 + 2,uVar13 + 8,2);
      opj_write_bytes_LE(pOVar4 + 4,0,2);
      opj_write_bytes_LE(pOVar4 + 6,
                         ((opj_mct_data_t *)(pOVar14 + -6))->m_element_type << 10 |
                         pOVar14[-5] << 8 | (uint)(byte)pOVar14[-4],2);
      opj_write_bytes_LE(pOVar4 + 8,0,2);
      memcpy(pOVar4 + 10,*(OPJ_BYTE **)(pOVar14 + -2),(ulong)*pOVar14);
      OVar5 = opj_stream_write_data
                        (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar7,
                         p_manager);
      if (OVar5 != uVar7) {
        return 0;
      }
      pOVar14 = pOVar14 + 8;
    }
    poVar8 = poVar3[uVar1].m_mcc_records;
    for (uVar6 = 0; uVar6 < poVar3[uVar1].m_nb_mcc_records; uVar6 = uVar6 + 1) {
      bVar15 = 0xff < poVar8->m_nb_comps;
      iVar12 = poVar8->m_nb_comps * 2 << bVar15;
      uVar10 = iVar12 + 0x13;
      uVar7 = (ulong)uVar10;
      pOVar4 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
      if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar10) {
        pOVar4 = (OPJ_BYTE *)opj_realloc(pOVar4,uVar7);
        if (pOVar4 == (OPJ_BYTE *)0x0) {
          opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
          (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
          (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
          fmt = "Not enough memory to write MCC marker\n";
          goto LAB_0011a2f2;
        }
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar4;
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar10;
      }
      uVar10 = bVar15 + 1;
      opj_write_bytes_LE(pOVar4,0xff75,2);
      opj_write_bytes_LE(pOVar4 + 2,iVar12 + 0x11,2);
      uVar13 = 0;
      opj_write_bytes_LE(pOVar4 + 4,0,2);
      opj_write_bytes_LE(pOVar4 + 6,poVar8->m_index,1);
      opj_write_bytes_LE(pOVar4 + 7,0,2);
      opj_write_bytes_LE(pOVar4 + 9,1,2);
      opj_write_bytes_LE(pOVar4 + 0xb,1,1);
      opj_write_bytes_LE(pOVar4 + 0xc,poVar8->m_nb_comps | (uint)bVar15 << 0xf,2);
      pOVar4 = pOVar4 + 0x10;
      while( true ) {
        if (poVar8->m_nb_comps <= uVar13) break;
        opj_write_bytes_LE(pOVar4 + -2,uVar13,uVar10);
        uVar13 = uVar13 + 1;
        pOVar4 = pOVar4 + uVar10;
      }
      opj_write_bytes_LE(pOVar4 + -2,poVar8->m_nb_comps | (uint)bVar15 << 0xf,2);
      for (uVar13 = 0; uVar13 < poVar8->m_nb_comps; uVar13 = uVar13 + 1) {
        opj_write_bytes_LE(pOVar4,uVar13,uVar10);
        pOVar4 = pOVar4 + uVar10;
      }
      OVar9 = (~*(uint *)&poVar8->field_0x18 & 1) << 0x10;
      if (poVar8->m_decorrelation_array != (opj_mct_data_t *)0x0) {
        OVar9 = OVar9 | poVar8->m_decorrelation_array->m_index;
      }
      if (poVar8->m_offset_array != (opj_mct_data_t *)0x0) {
        OVar9 = OVar9 | poVar8->m_offset_array->m_index << 8;
      }
      opj_write_bytes_LE(pOVar4,OVar9,3);
      OVar5 = opj_stream_write_data
                        (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar7,
                         p_manager);
      if (OVar5 != uVar7) {
        return 0;
      }
      poVar8 = poVar8 + 1;
    }
    pOVar4 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    poVar3 = (p_j2k->m_cp).tcps;
    uVar6 = p_j2k->m_current_tile_number;
    OVar9 = poVar3[uVar6].m_nb_mcc_records;
    uVar1 = OVar9 + 5;
    uVar7 = (ulong)uVar1;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar1) {
      pOVar4 = (OPJ_BYTE *)opj_realloc(pOVar4,uVar7);
      if (pOVar4 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
        opj_event_msg(p_manager,1,"Not enough memory to write MCO marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar4;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar1;
    }
    opj_write_bytes_LE(pOVar4,0xff77,2);
    opj_write_bytes_LE(pOVar4 + 2,OVar9 + 3,2);
    opj_write_bytes_LE(pOVar4 + 4,poVar3[uVar6].m_nb_mcc_records,1);
    poVar8 = poVar3[uVar6].m_mcc_records;
    for (lVar11 = 0; (uint)lVar11 < poVar3[uVar6].m_nb_mcc_records; lVar11 = lVar11 + 1) {
      opj_write_bytes_LE(pOVar4 + lVar11 + 5,poVar8->m_index,1);
      poVar8 = poVar8 + 1;
    }
    OVar5 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar7,
                       p_manager);
    if (OVar5 == uVar7) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 i;
    opj_simple_mcc_decorrelation_data_t * l_mcc_record;
    opj_mct_data_t * l_mct_record;
    opj_tcp_t * l_tcp;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    if (! opj_j2k_write_cbd(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_tcp = &(p_j2k->m_cp.tcps[p_j2k->m_current_tile_number]);
    l_mct_record = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {

        if (! opj_j2k_write_mct_record(p_j2k, l_mct_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mct_record;
    }

    l_mcc_record = l_tcp->m_mcc_records;

    for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {

        if (! opj_j2k_write_mcc_record(p_j2k, l_mcc_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mcc_record;
    }

    if (! opj_j2k_write_mco(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}